

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O3

CURLcode cw_out_flush_chain(cw_out_ctx *ctx,Curl_easy *data,cw_out_buf **pcwbuf,_Bool flush_all)

{
  dynbuf *s;
  cw_out_buf *pcVar1;
  cw_out_buf *pcVar2;
  CURLcode CVar3;
  cw_out_buf *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *buf;
  cw_out_buf *pcwbuf_00;
  undefined4 in_stack_ffffffffffffffb8;
  cw_out_type otype;
  size_t local_38;
  
  pcVar1 = *pcwbuf;
  if ((pcVar1 != (cw_out_buf *)0x0) && ((ctx->field_0x28 & 1) == 0)) {
    while (pcVar2 = pcVar1->next, pcVar4 = pcVar1, pcVar1->next != (cw_out_buf *)0x0) {
      do {
        pcwbuf_00 = pcVar4;
        pcVar4 = pcVar2;
        pcVar2 = pcVar4->next;
      } while (pcVar4->next != (cw_out_buf *)0x0);
      CVar3 = cw_out_flush_chain(ctx,data,&pcwbuf_00->next,SUB81(pcVar4,0));
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (pcwbuf_00->next != (cw_out_buf *)0x0) {
        return CURLE_OK;
      }
    }
    s = &pcVar1->b;
    sVar5 = Curl_dyn_len(s);
    if (sVar5 != 0) {
      otype = pcVar1->type;
      pcVar6 = Curl_dyn_ptr(s);
      buf = (char *)Curl_dyn_len(s);
      CVar3 = cw_out_ptr_flush(ctx,data,otype,SUB81(pcVar6,0),buf,(size_t)&local_38,
                               (size_t *)CONCAT44(otype,in_stack_ffffffffffffffb8));
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if (local_38 != 0) {
        sVar5 = Curl_dyn_len(s);
        if (local_38 == sVar5) {
          Curl_dyn_free(s);
        }
        else {
          sVar5 = Curl_dyn_len(s);
          CVar3 = Curl_dyn_tail(s,sVar5 - local_38);
          if (CVar3 != CURLE_OK) {
            return CVar3;
          }
        }
      }
    }
    sVar5 = Curl_dyn_len(s);
    if (sVar5 == 0) {
      Curl_dyn_free(s);
      (*Curl_cfree)(pcVar1);
      *pcwbuf = (cw_out_buf *)0x0;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cw_out_flush_chain(struct cw_out_ctx *ctx,
                                   struct Curl_easy *data,
                                   struct cw_out_buf **pcwbuf,
                                   bool flush_all)
{
  struct cw_out_buf *cwbuf = *pcwbuf;
  CURLcode result;

  if(!cwbuf)
    return CURLE_OK;
  if(ctx->paused)
    return CURLE_OK;

  /* write the end of the chain until it blocks or gets empty */
  while(cwbuf->next) {
    struct cw_out_buf **plast = &cwbuf->next;
    while((*plast)->next)
      plast = &(*plast)->next;
    result = cw_out_flush_chain(ctx, data, plast, flush_all);
    if(result)
      return result;
    if(*plast) {
      /* could not write last, paused again? */
      DEBUGASSERT(ctx->paused);
      return CURLE_OK;
    }
  }

  result = cw_out_buf_flush(ctx, data, cwbuf, flush_all);
  if(result)
    return result;
  if(!Curl_dyn_len(&cwbuf->b)) {
    cw_out_buf_free(cwbuf);
    *pcwbuf = NULL;
  }
  return CURLE_OK;
}